

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternal::cmELFInternal
          (cmELFInternal *this,cmELF *external,
          auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *fin,ByteOrderType order)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  ByteOrderType order_local;
  auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *fin_local;
  cmELF *external_local;
  cmELFInternal *this_local;
  
  this->_vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternal_00a7c870;
  this->External = external;
  pbVar1 = cmsys::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::release(fin);
  this->Stream = (istream *)pbVar1;
  this->ByteOrder = order;
  this->ELFType = FileTypeInvalid;
  std::
  map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
  ::map(&this->DynamicSectionStrings);
  this->NeedSwap = this->ByteOrder == ByteOrderMSB;
  this->DynamicSectionIndex = -1;
  return;
}

Assistant:

cmELFInternal(cmELF* external,
                cmsys::auto_ptr<cmsys::ifstream>& fin,
                ByteOrderType order):
    External(external),
    Stream(*fin.release()),
    ByteOrder(order),
    ELFType(cmELF::FileTypeInvalid)
    {
    // In most cases the processor-specific byte order will match that
    // of the target execution environment.  If we choose wrong here
    // it is fixed when the header is read.
#if KWIML_ABI_ENDIAN_ID == KWIML_ABI_ENDIAN_ID_LITTLE
    this->NeedSwap = (this->ByteOrder == ByteOrderMSB);
#elif KWIML_ABI_ENDIAN_ID == KWIML_ABI_ENDIAN_ID_BIG
    this->NeedSwap = (this->ByteOrder == ByteOrderLSB);
#else
    this->NeedSwap = false; // Final decision is at runtime anyway.
#endif

    // We have not yet loaded the section info.
    this->DynamicSectionIndex = -1;
    }